

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O1

bool __thiscall
leveldb::InternalFilterPolicy::KeyMayMatch(InternalFilterPolicy *this,Slice *key,Slice *f)

{
  int iVar1;
  
  if (7 < key->size_) {
    iVar1 = (*this->user_policy_->_vptr_FilterPolicy[4])();
    return SUB41(iVar1,0);
  }
  __assert_fail("internal_key.size() >= 8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/dbformat.h"
                ,0x5e,"Slice leveldb::ExtractUserKey(const Slice &)");
}

Assistant:

bool InternalFilterPolicy::KeyMayMatch(const Slice& key, const Slice& f) const {
  return user_policy_->KeyMayMatch(ExtractUserKey(key), f);
}